

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

uint8_t * __thiscall
arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Slice>(Builder *this,Slice *sub)

{
  bool bVar1;
  uint8_t *puVar2;
  Slice *in_RDI;
  Builder *in_stack_ffffffffffffffe0;
  Slice *item;
  Builder *in_stack_fffffffffffffff8;
  
  item = in_RDI;
  bVar1 = std::
          vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
          ::empty((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_stack_ffffffffffffffe0);
  if (bVar1) {
    puVar2 = set(in_stack_fffffffffffffff8,item);
  }
  else {
    if (((ulong)in_RDI[0x15]._start & 1) == 0) {
      reportAdd(in_stack_ffffffffffffffe0);
    }
    puVar2 = set(in_stack_fffffffffffffff8,item);
  }
  return puVar2;
}

Assistant:

uint8_t* addInternal(T const& sub) {
    if (_stack.empty() || std::is_same<T, Serializable>::value) {
      return set(sub);
    }

    if (!_keyWritten) {
      reportAdd();
    }
    try {
      return set(sub);
    } catch (...) {
      // clean up in case of an exception
      cleanupAdd();
      throw;
    }
  }